

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *key_exchange_id,uint16_t *csid,
              ptls_iovec_t *negotiated_protocol,uint8_t *src,uint8_t *end)

{
  byte *pbVar1;
  byte *pbVar2;
  undefined8 *in_RCX;
  byte *pbVar3;
  undefined8 *in_RSI;
  ptls_iovec_t pVar4;
  undefined8 *in_stack_00000008;
  byte *in_stack_00000010;
  byte *in_stack_00000018;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *in_stack_fffffffffffffed8;
  uint8_t **in_stack_fffffffffffffee0;
  uint64_t *in_stack_fffffffffffffee8;
  uint8_t *local_108;
  size_t local_100;
  ulong local_e0;
  long local_d8;
  uint8_t *local_d0;
  size_t local_c8;
  ulong local_a8;
  long local_a0;
  uint8_t *local_98;
  size_t local_90;
  ulong local_70;
  long local_68;
  ulong local_48;
  long local_40;
  int local_34;
  
  local_40 = 2;
  if ((ulong)((long)in_stack_00000018 - (long)in_stack_00000010) < 2) {
    local_34 = 0x32;
  }
  else {
    local_48 = 0;
    pbVar3 = in_stack_00000010;
    do {
      in_stack_00000010 = pbVar3;
      pbVar3 = in_stack_00000010 + 1;
      local_48 = local_48 << 8 | (ulong)*in_stack_00000010;
      local_40 = local_40 + -1;
    } while (local_40 != 0);
    if ((ulong)((long)in_stack_00000018 - (long)pbVar3) < local_48) {
      local_34 = 0x32;
    }
    else {
      pbVar1 = pbVar3 + local_48;
      if (((ulong)((long)pbVar1 - (long)pbVar3) < 8) || (*(long *)pbVar3 != 0x31303030736c7470)) {
        local_34 = 0x32;
      }
      else {
        local_34 = ptls_decode64(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                 in_stack_fffffffffffffed8);
        if (local_34 == 0) {
          local_68 = 2;
          if ((ulong)((long)pbVar1 - (long)(in_stack_00000010 + 9)) < 2) {
            local_34 = 0x32;
          }
          else {
            local_70 = 0;
            in_stack_00000010 = in_stack_00000010 + 9;
            do {
              pbVar3 = in_stack_00000010 + 1;
              local_70 = local_70 << 8 | (ulong)*in_stack_00000010;
              local_68 = local_68 + -1;
              in_stack_00000010 = pbVar3;
            } while (local_68 != 0);
            if ((ulong)((long)pbVar1 - (long)pbVar3) < local_70) {
              local_34 = 0x32;
            }
            else {
              in_stack_00000010 = pbVar3 + local_70;
              pVar4 = ptls_iovec_init(pbVar3,(long)in_stack_00000010 - (long)pbVar3);
              local_98 = pVar4.base;
              *in_RSI = local_98;
              local_90 = pVar4.len;
              in_RSI[1] = local_90;
              local_34 = ptls_decode16((uint16_t *)in_stack_fffffffffffffee8,
                                       in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
              if (((local_34 == 0) &&
                  (local_34 = ptls_decode16((uint16_t *)in_stack_fffffffffffffee8,
                                            in_stack_fffffffffffffee0,in_stack_fffffffffffffed8),
                  local_34 == 0)) &&
                 (local_34 = ptls_decode32((uint32_t *)in_stack_fffffffffffffee8,
                                           in_stack_fffffffffffffee0,in_stack_fffffffffffffed8),
                 local_34 == 0)) {
                local_a0 = 2;
                if ((ulong)((long)pbVar1 - (long)in_stack_00000010) < 2) {
                  local_34 = 0x32;
                }
                else {
                  local_a8 = 0;
                  do {
                    pbVar3 = in_stack_00000010 + 1;
                    local_a8 = local_a8 << 8 | (ulong)*in_stack_00000010;
                    local_a0 = local_a0 + -1;
                    in_stack_00000010 = pbVar3;
                  } while (local_a0 != 0);
                  if ((ulong)((long)pbVar1 - (long)pbVar3) < local_a8) {
                    local_34 = 0x32;
                  }
                  else {
                    in_stack_00000010 = pbVar3 + local_a8;
                    pVar4 = ptls_iovec_init(pbVar3,(long)in_stack_00000010 - (long)pbVar3);
                    local_d0 = pVar4.base;
                    *in_RCX = local_d0;
                    local_c8 = pVar4.len;
                    in_RCX[1] = local_c8;
                    local_d8 = 1;
                    if (pbVar1 == in_stack_00000010) {
                      local_34 = 0x32;
                    }
                    else {
                      local_e0 = 0;
                      do {
                        pbVar3 = in_stack_00000010 + 1;
                        local_e0 = local_e0 << 8 | (ulong)*in_stack_00000010;
                        local_d8 = local_d8 + -1;
                        in_stack_00000010 = pbVar3;
                      } while (local_d8 != 0);
                      if ((ulong)((long)pbVar1 - (long)pbVar3) < local_e0) {
                        local_34 = 0x32;
                      }
                      else {
                        pbVar2 = pbVar3 + local_e0;
                        pVar4 = ptls_iovec_init(pbVar3,(long)pbVar2 - (long)pbVar3);
                        local_108 = pVar4.base;
                        *in_stack_00000008 = local_108;
                        local_100 = pVar4.len;
                        in_stack_00000008[1] = local_100;
                        if (pbVar2 == pbVar1) {
                          if (pbVar2 != in_stack_00000018) {
                            local_34 = 0x32;
                          }
                        }
                        else {
                          local_34 = 0x32;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *key_exchange_id, uint16_t *csid, ptls_iovec_t *negotiated_protocol, const uint8_t *src,
                              const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_block(src, end, 2, {
        if (end - src < SESSION_IDENTIFIER_MAGIC_SIZE ||
            memcmp(src, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += SESSION_IDENTIFIER_MAGIC_SIZE;
        if ((ret = ptls_decode64(issued_at, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = ptls_decode16(key_exchange_id, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
        ptls_decode_open_block(src, end, 1, {
            *negotiated_protocol = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}